

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

char * SHA512_End(SHA512_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_64;
  sha2_byte **ppsStack_60;
  int i;
  sha2_byte *d;
  sha2_byte digest [64];
  char *buffer_local;
  SHA512_CTX *context_local;
  
  ppsStack_60 = &d;
  digest._56_8_ = buffer;
  if (context != (SHA512_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      memset(context,0,0xd0);
    }
    else {
      SHA512_Final((uchar *)&d,(SHA512_CTX *)context);
      for (local_64 = 0; local_64 < 0x40; local_64 = local_64 + 1) {
        pcVar1 = (char *)(digest._56_8_ + 1);
        *(char *)digest._56_8_ = sha2_hex_digits[(int)(*(byte *)ppsStack_60 & 0xf0) >> 4];
        digest._56_8_ = digest._56_8_ + 2;
        *pcVar1 = sha2_hex_digits[(int)(*(byte *)ppsStack_60 & 0xf)];
        ppsStack_60 = (sha2_byte **)((long)ppsStack_60 + 1);
      }
      *(undefined1 *)digest._56_8_ = 0;
    }
    memset(&d,0,0x40);
    return (char *)digest._56_8_;
  }
  __assert_fail("context != (SHA512_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x3b9,"char *SHA512_End(SHA512_CTX *, char *)");
}

Assistant:

char *SHA512_End(SHA512_CTX* context, char buffer[SHA512_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0);

	if (buffer != (char*)0) {
		SHA512_Final(digest, context);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA512_CTX));
	}
	MEMSET_BZERO(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}